

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

int __thiscall
FOptionMenuItemColorPicker::Draw
          (FOptionMenuItemColorPicker *this,FOptionMenuDescriptor *desc,int y,int indent,
          bool selected)

{
  EColorRange *pEVar1;
  uint uVar2;
  undefined7 in_register_00000081;
  
  pEVar1 = &OptionSettings.mFontColor;
  if ((int)CONCAT71(in_register_00000081,selected) != 0) {
    pEVar1 = &OptionSettings.mFontColorSelection;
  }
  FOptionMenuItem::drawLabel(&this->super_FOptionMenuItem,indent,y,*pEVar1,false);
  if (this->mCVar != (FColorCVar *)0x0) {
    uVar2 = CleanXfac_1 * 0xe + indent;
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,(ulong)uVar2,(ulong)(uint)(y + CleanYfac_1),
               (ulong)(CleanXfac_1 * 0x20 + uVar2),
               (ulong)(uint)(CleanYfac_1 * OptionSettings.mLinespacing + y + CleanYfac_1),
               0xffffffffffffffff,(this->mCVar->super_FIntCVar).Value | 0xff000000);
  }
  return indent;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		drawLabel(indent, y, selected? OptionSettings.mFontColorSelection : OptionSettings.mFontColor);

		if (mCVar != NULL)
		{
			int box_x = indent + CURSORSPACE;
			int box_y = y + CleanYfac_1;
			screen->Clear (box_x, box_y, box_x + 32*CleanXfac_1, box_y + OptionSettings.mLinespacing*CleanYfac_1,
				-1, (uint32)*mCVar | 0xff000000);
		}
		return indent;
	}